

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

pair<const_char_*,_unsigned_int> google::protobuf::internal::ReadTagFallback(char *p,uint32 res)

{
  uint in_ESI;
  long in_RDI;
  pair<const_char_*,_unsigned_int> pVar1;
  uint32 byte;
  uint32_t i;
  int local_3c;
  void *local_38;
  char *local_30;
  uint local_24;
  uint local_20;
  uint local_1c [3];
  undefined1 local_10 [12];
  
  local_20 = 2;
  local_1c[0] = in_ESI;
  do {
    if (4 < local_20) {
      local_38 = (void *)0x0;
      local_3c = 0;
      std::pair<const_char_*,_unsigned_int>::pair<std::nullptr_t,_int,_true>
                ((pair<const_char_*,_unsigned_int> *)local_10,&local_38,&local_3c);
LAB_003ec2f7:
      pVar1._12_4_ = 0;
      pVar1.first = (char *)local_10._0_8_;
      pVar1.second = local_10._8_4_;
      return pVar1;
    }
    local_24 = (uint)*(byte *)(in_RDI + (ulong)local_20);
    local_1c[0] = (local_24 - 1 << ((char)local_20 * '\a' & 0x1fU)) + local_1c[0];
    if (local_24 < 0x80) {
      local_30 = (char *)(in_RDI + (ulong)local_20 + 1);
      std::pair<const_char_*,_unsigned_int>::pair<const_char_*,_unsigned_int_&,_true>
                ((pair<const_char_*,_unsigned_int> *)local_10,&local_30,local_1c);
      goto LAB_003ec2f7;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

std::pair<const char*, uint32> ReadTagFallback(const char* p, uint32 res) {
  for (std::uint32_t i = 2; i < 5; i++) {
    uint32 byte = static_cast<uint8>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}